

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walBusyLock(Wal *pWal,_func_int_void_ptr *xBusy,void *pBusyArg,int lockIdx,int n)

{
  int iVar1;
  
  while( true ) {
    iVar1 = walLockExclusive(pWal,lockIdx,n);
    if (xBusy == (_func_int_void_ptr *)0x0) {
      return iVar1;
    }
    if (iVar1 != 5) break;
    iVar1 = (*xBusy)(pBusyArg);
    if (iVar1 == 0) {
      return 5;
    }
  }
  return iVar1;
}

Assistant:

static int walBusyLock(
  Wal *pWal,                      /* WAL connection */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int lockIdx,                    /* Offset of first byte to lock */
  int n                           /* Number of bytes to lock */
){
  int rc;
  do {
    rc = walLockExclusive(pWal, lockIdx, n);
  }while( xBusy && rc==SQLITE_BUSY && xBusy(pBusyArg) );
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ){
    walDisableBlocking(pWal);
    rc = SQLITE_BUSY;
  }
#endif
  return rc;
}